

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O1

void __thiscall
YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::proxy
          (proxy *this,iterator_value *x)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->m_ref).super_Node.m_isValid = (x->super_Node).m_isValid;
  (this->m_ref).super_Node.m_invalidKey._M_dataplus._M_p =
       (pointer)&(this->m_ref).super_Node.m_invalidKey.field_2;
  pcVar1 = (x->super_Node).m_invalidKey._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_ref).super_Node.m_invalidKey,pcVar1,
             pcVar1 + (x->super_Node).m_invalidKey._M_string_length);
  (this->m_ref).super_Node.m_pMemory.
  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (x->super_Node).m_pMemory.
       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (x->super_Node).m_pMemory.
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_ref).super_Node.m_pMemory.
  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->m_ref).super_Node.m_pNode = (x->super_Node).m_pNode;
  std::pair<YAML::Node,_YAML::Node>::pair
            (&(this->m_ref).super_pair<YAML::Node,_YAML::Node>,
             &x->super_pair<YAML::Node,_YAML::Node>);
  return;
}

Assistant:

explicit proxy(const V& x) : m_ref(x) {}